

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XCryptionCommon.cpp
# Opt level: O1

ByteList * __thiscall
XCryptionCommon::OnObjectStart_abi_cxx11_
          (XCryptionCommon *this,longlong inObjectID,longlong inGenerationNumber)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  _List_node_base local_30;
  _List_node_base *local_20;
  
  algorithm3_1((ByteList *)&local_30,(XCryptionCommon *)inObjectID,inObjectID,inGenerationNumber,
               &this->mEncryptionKey,this->mUsingAES);
  p_Var2 = (_List_node_base *)operator_new(0x28);
  p_Var3 = p_Var2 + 1;
  p_Var2[1]._M_next = local_30._M_next;
  p_Var2[1]._M_prev = local_30._M_prev;
  p_Var2[2]._M_next = local_20;
  if (local_30._M_next == &local_30) {
    p_Var2[1]._M_prev = p_Var3;
    p_Var2[1]._M_next = p_Var3;
  }
  else {
    (local_30._M_prev)->_M_next = p_Var3;
    p_Var3->_M_next->_M_prev = p_Var3;
    local_20 = (_List_node_base *)0x0;
    local_30._M_next = &local_30;
    local_30._M_prev = &local_30;
  }
  std::__detail::_List_node_base::_M_hook(p_Var2);
  psVar1 = &(this->mEncryptionKeysStack).
            super__List_base<std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  p_Var2 = local_30._M_next;
  while (p_Var2 != &local_30) {
    p_Var3 = (((_List_base<unsigned_char,_std::allocator<unsigned_char>_> *)&p_Var2->_M_next)->
             _M_impl)._M_node.super__List_node_base._M_next;
    operator_delete(p_Var2,0x18);
    p_Var2 = p_Var3;
  }
  return (ByteList *)
         ((this->mEncryptionKeysStack).
          super__List_base<std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ._M_impl._M_node.super__List_node_base._M_prev + 1);
}

Assistant:

const ByteList& XCryptionCommon::OnObjectStart(long long inObjectID, long long inGenerationNumber) {
	mEncryptionKeysStack.push_back(ComputeEncryptionKeyForObject((ObjectIDType)inObjectID, (unsigned long)inGenerationNumber));

	return mEncryptionKeysStack.back();
}